

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summarycalc.cpp
# Opt level: O1

void __thiscall
summarycalc::dosummary
          (summarycalc *this,int sample_size,int event_id,int item_id,int coverage_or_output_id,
          int sidx,OASIS_FLOAT gul,OASIS_FLOAT expval)

{
  int iVar1;
  int *piVar2;
  int *piVar3;
  int i_1;
  int i;
  long lVar4;
  
  iVar1 = this->last_event_id_;
  if (iVar1 != event_id) {
    if (iVar1 != -1) {
      lVar4 = 0;
      do {
        if (this->fout[lVar4] != (FILE *)0x0) {
          outputsummaryset(this,sample_size,(int)lVar4,iVar1);
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 != 10);
      lVar4 = 0;
      do {
        if (this->fout[lVar4] != (FILE *)0x0) {
          reset_ssl_array(this,(int)lVar4,sample_size,this->sssl[lVar4]);
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 != 10);
    }
    this->last_event_id_ = event_id;
    this->last_item_id_ = -1;
    reset_sse_array(this);
  }
  if (this->last_item_id_ != item_id) {
    piVar3 = (this->foutIndex_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar2 = (this->foutIndex_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (piVar3 != piVar2) {
      do {
        iVar1 = (this->co_to_s_[*piVar3]->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start[coverage_or_output_id];
        this->sse[*piVar3][iVar1] = this->sse[*piVar3][iVar1] + expval;
        piVar3 = piVar3 + 1;
      } while (piVar3 != piVar2);
    }
    this->last_item_id_ = item_id;
  }
  piVar3 = (this->foutIndex_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar2 = (this->foutIndex_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (piVar3 != piVar2) {
    lVar4 = (long)sidx + (long)this->num_idx_;
    do {
      this->sssl[*piVar3]
      [(this->co_to_s_[*piVar3]->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
       super__Vector_impl_data._M_start[coverage_or_output_id]][lVar4] =
           this->sssl[*piVar3]
           [(this->co_to_s_[*piVar3]->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start[coverage_or_output_id]][lVar4] + gul;
      piVar3 = piVar3 + 1;
    } while (piVar3 != piVar2);
  }
  return;
}

Assistant:

void summarycalc::dosummary(int sample_size, int event_id, int item_id,
			    int coverage_or_output_id, int sidx,
			    OASIS_FLOAT gul, OASIS_FLOAT expval)
{
	if (last_event_id_ != event_id)
		reset_for_new_event(sample_size, event_id);

	if (item_id != last_item_id_) {
		for (auto it = foutIndex_.begin(); it != foutIndex_.end(); ++it) {
			coverage_id_or_output_id_to_Summary_id &p = *co_to_s_[*it];
			int summary_id = p[coverage_or_output_id];
			OASIS_FLOAT *se = sse[*it];
			se[summary_id] += expval;
		}
		last_item_id_ = item_id;
	}

	processsummarysets(coverage_or_output_id, sidx, gul);
}